

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O1

double insphereexact(double *pa,double *pb,double *pc,double *pd,double *pe)

{
  double dVar1;
  double b;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double ce [4];
  double bd [4];
  double ab [4];
  double eb [4];
  double da [4];
  double ac [4];
  double ea [4];
  double de [4];
  double cd [4];
  double bc [4];
  double temp48b [48];
  double temp48a [48];
  double eac [24];
  double deb [24];
  double cda [24];
  double bce [24];
  double abd [24];
  double eab [24];
  double dea [24];
  double cde [24];
  double bcd [24];
  double abc [24];
  double temp8b [8];
  double temp8a [8];
  double temp16 [16];
  double det384x [384];
  double temp192 [192];
  double det384z [384];
  double det384y [384];
  double eabc [96];
  double deab [96];
  double cdea [96];
  double bcde [96];
  double abcd [96];
  double detxy [768];
  double ddet [1152];
  double cdet [1152];
  double bdet [1152];
  double adet [1152];
  double edet [1152];
  double cddet [2304];
  double abdet [2304];
  double deter [5760];
  double cdedet [3456];
  double dStack_2c1f8;
  double dStack_2c1f0;
  double dStack_2c1e8;
  double dStack_2c1e0;
  double dStack_2c1d8;
  double dStack_2c1d0;
  double dStack_2c1c8;
  double dStack_2c1c0;
  double dStack_2c1b8;
  double dStack_2c1b0;
  double dStack_2c1a8;
  double dStack_2c1a0;
  double dStack_2c198;
  double dStack_2c190;
  double dStack_2c188;
  double dStack_2c180;
  double dStack_2c178;
  double dStack_2c170;
  double dStack_2c168;
  double dStack_2c160;
  double dStack_2c158;
  double dStack_2c150;
  double dStack_2c148;
  double dStack_2c140;
  double dStack_2c138;
  double dStack_2c130;
  double dStack_2c128;
  double dStack_2c120;
  double dStack_2c118;
  double dStack_2c110;
  double dStack_2c108;
  double dStack_2c100;
  double dStack_2c0f8;
  double dStack_2c0f0;
  double dStack_2c0e8;
  double dStack_2c0e0;
  double dStack_2c0d8;
  double dStack_2c0d0;
  double dStack_2c0c8;
  double dStack_2c0c0;
  double adStack_2c0b8 [48];
  double adStack_2bf38 [48];
  double adStack_2bdb8 [24];
  double adStack_2bcf8 [24];
  double adStack_2bc38 [24];
  double adStack_2bb78 [24];
  double adStack_2bab8 [24];
  double adStack_2b9f8 [24];
  double adStack_2b938 [24];
  double adStack_2b878 [24];
  double adStack_2b7b8 [24];
  double adStack_2b6f8 [24];
  double adStack_2b638 [8];
  double adStack_2b5f8 [8];
  double adStack_2b5b8 [16];
  double adStack_2b538 [384];
  double adStack_2a938 [192];
  double adStack_2a338 [384];
  double adStack_29738 [384];
  double adStack_28b38 [96];
  double adStack_28838 [96];
  double adStack_28538 [96];
  double adStack_28238 [96];
  double adStack_27f38 [96];
  double adStack_27c38 [768];
  double adStack_26438 [1152];
  double adStack_24038 [1152];
  double adStack_21c38 [1152];
  double adStack_1f838 [1152];
  double adStack_1d438 [1152];
  double adStack_1b038 [2304];
  double adStack_16838 [2303];
  double adStack_12040 [5761];
  double local_6c38 [3457];
  
  dVar1 = *pa;
  b = pa[1];
  dVar44 = *pb;
  dVar30 = pb[1];
  dVar53 = dVar1 * dVar30;
  dVar25 = dVar1 * splitter - (dVar1 * splitter - dVar1);
  dVar18 = dVar1 - dVar25;
  dVar22 = dVar30 * splitter - (dVar30 * splitter - dVar30);
  dVar51 = dVar30 - dVar22;
  dVar23 = dVar18 * dVar51 - (((dVar53 - dVar25 * dVar22) - dVar18 * dVar22) - dVar25 * dVar51);
  dVar19 = dVar44 * b;
  dVar41 = splitter * dVar44 - (splitter * dVar44 - dVar44);
  dVar46 = splitter * b - (splitter * b - b);
  dVar43 = dVar44 - dVar41;
  dVar35 = b - dVar46;
  dVar26 = dVar43 * dVar35 - (((dVar19 - dVar41 * dVar46) - dVar43 * dVar46) - dVar41 * dVar35);
  dVar31 = dVar23 - dVar26;
  dStack_2c1b8 = (dVar23 - (dVar31 + (dVar23 - dVar31))) + ((dVar23 - dVar31) - dVar26);
  dVar23 = dVar53 + dVar31;
  dVar53 = (dVar53 - (dVar23 - (dVar23 - dVar53))) + (dVar31 - (dVar23 - dVar53));
  dVar26 = dVar53 - dVar19;
  dStack_2c1b0 = (dVar53 - (dVar26 + (dVar53 - dVar26))) + ((dVar53 - dVar26) - dVar19);
  dStack_2c1a0 = dVar23 + dVar26;
  dStack_2c1a8 = (dVar23 - (dStack_2c1a0 - (dStack_2c1a0 - dVar23))) +
                 (dVar26 - (dStack_2c1a0 - dVar23));
  dVar53 = pc[1];
  dVar47 = splitter * dVar53 - (splitter * dVar53 - dVar53);
  dVar23 = dVar44 * dVar53;
  dVar49 = dVar53 - dVar47;
  dVar31 = dVar43 * dVar49 - (((dVar23 - dVar41 * dVar47) - dVar43 * dVar47) - dVar41 * dVar49);
  dVar19 = *pc;
  dVar38 = splitter * dVar19 - (splitter * dVar19 - dVar19);
  dVar26 = dVar30 * dVar19;
  dVar36 = dVar19 - dVar38;
  dVar27 = dVar36 * dVar51 - (((dVar26 - dVar38 * dVar22) - dVar36 * dVar22) - dVar38 * dVar51);
  dVar32 = dVar31 - dVar27;
  dStack_2c0d8 = (dVar31 - (dVar32 + (dVar31 - dVar32))) + ((dVar31 - dVar32) - dVar27);
  dVar31 = dVar23 + dVar32;
  dVar23 = (dVar23 - (dVar31 - (dVar31 - dVar23))) + (dVar32 - (dVar31 - dVar23));
  dVar27 = dVar23 - dVar26;
  dStack_2c0d0 = (dVar23 - (dVar27 + (dVar23 - dVar27))) + ((dVar23 - dVar27) - dVar26);
  dStack_2c0c0 = dVar31 + dVar27;
  dStack_2c0c8 = (dVar31 - (dStack_2c0c0 - (dStack_2c0c0 - dVar31))) +
                 (dVar27 - (dStack_2c0c0 - dVar31));
  dVar23 = pd[1];
  dVar52 = splitter * dVar23 - (splitter * dVar23 - dVar23);
  dVar31 = dVar19 * dVar23;
  dVar33 = dVar23 - dVar52;
  dVar32 = dVar36 * dVar33 - (((dVar31 - dVar38 * dVar52) - dVar36 * dVar52) - dVar38 * dVar33);
  dVar26 = *pd;
  dVar39 = splitter * dVar26 - (splitter * dVar26 - dVar26);
  dVar27 = dVar53 * dVar26;
  dVar42 = dVar26 - dVar39;
  dVar28 = dVar42 * dVar49 - (((dVar27 - dVar39 * dVar47) - dVar42 * dVar47) - dVar39 * dVar49);
  dVar34 = dVar32 - dVar28;
  dStack_2c0f8 = (dVar32 - (dVar34 + (dVar32 - dVar34))) + ((dVar32 - dVar34) - dVar28);
  dVar32 = dVar31 + dVar34;
  dVar31 = (dVar31 - (dVar32 - (dVar32 - dVar31))) + (dVar34 - (dVar32 - dVar31));
  dVar28 = dVar31 - dVar27;
  dStack_2c0f0 = (dVar31 - (dVar28 + (dVar31 - dVar28))) + ((dVar31 - dVar28) - dVar27);
  dStack_2c0e0 = dVar32 + dVar28;
  dStack_2c0e8 = (dVar32 - (dStack_2c0e0 - (dStack_2c0e0 - dVar32))) +
                 (dVar28 - (dStack_2c0e0 - dVar32));
  dVar31 = pe[1];
  dVar20 = splitter * dVar31 - (splitter * dVar31 - dVar31);
  dVar48 = dVar26 * dVar31;
  dVar32 = dVar1 * dVar31;
  dVar28 = b * dVar19;
  dVar19 = dVar19 * dVar31;
  dVar34 = dVar44 * dVar31;
  dVar31 = dVar31 - dVar20;
  dVar50 = dVar42 * dVar31 - (((dVar48 - dVar39 * dVar20) - dVar42 * dVar20) - dVar39 * dVar31);
  dVar27 = *pe;
  dVar45 = splitter * dVar27 - (splitter * dVar27 - dVar27);
  dVar29 = dVar23 * dVar27;
  dVar21 = b * dVar27;
  dVar40 = dVar1 * dVar53;
  dVar53 = dVar53 * dVar27;
  dVar2 = dVar30 * dVar27;
  dVar27 = dVar27 - dVar45;
  dVar24 = dVar27 * dVar33 - (((dVar29 - dVar45 * dVar52) - dVar27 * dVar52) - dVar45 * dVar33);
  dVar37 = dVar50 - dVar24;
  dStack_2c118 = (dVar50 - (dVar37 + (dVar50 - dVar37))) + ((dVar50 - dVar37) - dVar24);
  dVar24 = dVar48 + dVar37;
  dVar48 = (dVar48 - (dVar24 - (dVar24 - dVar48))) + (dVar37 - (dVar24 - dVar48));
  dVar37 = dVar48 - dVar29;
  dStack_2c110 = (dVar48 - (dVar37 + (dVar48 - dVar37))) + ((dVar48 - dVar37) - dVar29);
  dStack_2c100 = dVar24 + dVar37;
  dStack_2c108 = (dVar24 - (dStack_2c100 - (dStack_2c100 - dVar24))) +
                 (dVar37 - (dStack_2c100 - dVar24));
  dVar24 = dVar27 * dVar35 - (((dVar21 - dVar45 * dVar46) - dVar27 * dVar46) - dVar45 * dVar35);
  dVar37 = dVar18 * dVar31 - (((dVar32 - dVar25 * dVar20) - dVar18 * dVar20) - dVar25 * dVar31);
  dVar29 = dVar24 - dVar37;
  dStack_2c138 = (dVar24 - (dVar29 + (dVar24 - dVar29))) + ((dVar24 - dVar29) - dVar37);
  dVar24 = dVar21 + dVar29;
  dVar21 = (dVar21 - (dVar24 - (dVar24 - dVar21))) + (dVar29 - (dVar24 - dVar21));
  dVar37 = dVar21 - dVar32;
  dStack_2c130 = (dVar21 - (dVar37 + (dVar21 - dVar37))) + ((dVar21 - dVar37) - dVar32);
  dStack_2c120 = dVar24 + dVar37;
  dStack_2c128 = (dVar24 - (dStack_2c120 - (dStack_2c120 - dVar24))) +
                 (dVar37 - (dStack_2c120 - dVar24));
  dVar24 = dVar18 * dVar49 - (((dVar40 - dVar25 * dVar47) - dVar18 * dVar47) - dVar25 * dVar49);
  dVar32 = dVar36 * dVar35 - (((dVar28 - dVar38 * dVar46) - dVar36 * dVar46) - dVar38 * dVar35);
  dVar21 = dVar24 - dVar32;
  dStack_2c158 = (dVar24 - (dVar21 + (dVar24 - dVar21))) + ((dVar24 - dVar21) - dVar32);
  dVar32 = dVar40 + dVar21;
  dVar21 = (dVar40 - (dVar32 - (dVar32 - dVar40))) + (dVar21 - (dVar32 - dVar40));
  dVar24 = dVar21 - dVar28;
  dStack_2c150 = (dVar21 - (dVar24 + (dVar21 - dVar24))) + ((dVar21 - dVar24) - dVar28);
  dStack_2c140 = dVar32 + dVar24;
  dStack_2c148 = (dVar32 - (dStack_2c140 - (dStack_2c140 - dVar32))) +
                 (dVar24 - (dStack_2c140 - dVar32));
  dVar44 = dVar44 * dVar23;
  dVar24 = dVar43 * dVar33 - (((dVar44 - dVar41 * dVar52) - dVar43 * dVar52) - dVar41 * dVar33);
  dVar30 = dVar30 * dVar26;
  dVar32 = dVar42 * dVar51 - (((dVar30 - dVar39 * dVar22) - dVar42 * dVar22) - dVar39 * dVar51);
  dVar28 = dVar24 - dVar32;
  dStack_2c1d8 = (dVar24 - (dVar28 + (dVar24 - dVar28))) + ((dVar24 - dVar28) - dVar32);
  dVar32 = dVar44 + dVar28;
  dVar28 = (dVar44 - (dVar32 - (dVar32 - dVar44))) + (dVar28 - (dVar32 - dVar44));
  dVar44 = dVar28 - dVar30;
  dStack_2c1d0 = (dVar28 - (dVar44 + (dVar28 - dVar44))) + ((dVar28 - dVar44) - dVar30);
  dStack_2c1c0 = dVar32 + dVar44;
  dStack_2c1c8 = (dVar32 - (dStack_2c1c0 - (dStack_2c1c0 - dVar32))) +
                 (dVar44 - (dStack_2c1c0 - dVar32));
  dVar32 = dVar36 * dVar31 - (((dVar19 - dVar38 * dVar20) - dVar36 * dVar20) - dVar38 * dVar31);
  dVar30 = dVar49 * dVar27 - (((dVar53 - dVar45 * dVar47) - dVar47 * dVar27) - dVar45 * dVar49);
  dVar44 = dVar32 - dVar30;
  dStack_2c1f8 = (dVar32 - (dVar44 + (dVar32 - dVar44))) + ((dVar32 - dVar44) - dVar30);
  dVar30 = dVar19 + dVar44;
  dVar19 = (dVar19 - (dVar30 - (dVar30 - dVar19))) + (dVar44 - (dVar30 - dVar19));
  dVar44 = dVar19 - dVar53;
  dStack_2c1f0 = (dVar19 - (dVar44 + (dVar19 - dVar44))) + ((dVar19 - dVar44) - dVar53);
  dStack_2c1e0 = dVar30 + dVar44;
  dStack_2c1e8 = (dVar30 - (dStack_2c1e0 - (dStack_2c1e0 - dVar30))) +
                 (dVar44 - (dStack_2c1e0 - dVar30));
  dVar26 = dVar26 * b;
  dVar30 = dVar42 * dVar35 - (((dVar26 - dVar39 * dVar46) - dVar46 * dVar42) - dVar39 * dVar35);
  dVar23 = dVar23 * dVar1;
  dVar53 = dVar33 * dVar18 - (((dVar23 - dVar25 * dVar52) - dVar52 * dVar18) - dVar25 * dVar33);
  dVar44 = dVar30 - dVar53;
  dStack_2c178 = (dVar30 - (dVar44 + (dVar30 - dVar44))) + ((dVar30 - dVar44) - dVar53);
  dVar30 = dVar26 + dVar44;
  dVar53 = (dVar26 - (dVar30 - (dVar30 - dVar26))) + (dVar44 - (dVar30 - dVar26));
  dVar44 = dVar53 - dVar23;
  dStack_2c170 = (dVar53 - (dVar44 + (dVar53 - dVar44))) + ((dVar53 - dVar44) - dVar23);
  dStack_2c160 = dVar30 + dVar44;
  dStack_2c168 = (dVar30 - (dStack_2c160 - (dStack_2c160 - dVar30))) +
                 (dVar44 - (dStack_2c160 - dVar30));
  dVar44 = dVar27 * dVar51 - (((dVar2 - dVar45 * dVar22) - dVar22 * dVar27) - dVar45 * dVar51);
  dVar53 = dVar31 * dVar43 - (((dVar34 - dVar41 * dVar20) - dVar20 * dVar43) - dVar41 * dVar31);
  dVar30 = dVar44 - dVar53;
  dStack_2c198 = (dVar44 - (dVar30 + (dVar44 - dVar30))) + ((dVar44 - dVar30) - dVar53);
  dVar44 = dVar2 + dVar30;
  dVar53 = (dVar2 - (dVar44 - (dVar44 - dVar2))) + (dVar30 - (dVar44 - dVar2));
  dVar30 = dVar53 - dVar34;
  dStack_2c190 = (dVar53 - (dVar30 + (dVar53 - dVar30))) + ((dVar53 - dVar30) - dVar34);
  dStack_2c180 = dVar44 + dVar30;
  dStack_2c188 = (dVar44 - (dStack_2c180 - (dStack_2c180 - dVar44))) +
                 (dVar30 - (dStack_2c180 - dVar44));
  dVar44 = pa[2];
  iVar3 = scale_expansion_zeroelim(4,&dStack_2c0d8,dVar44,adStack_2b5f8);
  dVar30 = pb[2];
  iVar4 = scale_expansion_zeroelim(4,&dStack_2c158,-dVar30,adStack_2b638);
  iVar3 = fast_expansion_sum_zeroelim(iVar3,adStack_2b5f8,iVar4,adStack_2b638,adStack_2b5b8);
  dVar53 = pc[2];
  iVar4 = scale_expansion_zeroelim(4,&dStack_2c1b8,dVar53,adStack_2b5f8);
  iVar3 = fast_expansion_sum_zeroelim(iVar4,adStack_2b5f8,iVar3,adStack_2b5b8,adStack_2b6f8);
  iVar4 = scale_expansion_zeroelim(4,&dStack_2c0f8,dVar30,adStack_2b5f8);
  iVar5 = scale_expansion_zeroelim(4,&dStack_2c1d8,-dVar53,adStack_2b638);
  iVar4 = fast_expansion_sum_zeroelim(iVar4,adStack_2b5f8,iVar5,adStack_2b638,adStack_2b5b8);
  dVar19 = pd[2];
  iVar5 = scale_expansion_zeroelim(4,&dStack_2c0d8,dVar19,adStack_2b5f8);
  iVar4 = fast_expansion_sum_zeroelim(iVar5,adStack_2b5f8,iVar4,adStack_2b5b8,adStack_2b7b8);
  iVar5 = scale_expansion_zeroelim(4,&dStack_2c118,dVar53,adStack_2b5f8);
  iVar6 = scale_expansion_zeroelim(4,&dStack_2c1f8,-dVar19,adStack_2b638);
  iVar5 = fast_expansion_sum_zeroelim(iVar5,adStack_2b5f8,iVar6,adStack_2b638,adStack_2b5b8);
  dVar23 = pe[2];
  iVar6 = scale_expansion_zeroelim(4,&dStack_2c0f8,dVar23,adStack_2b5f8);
  iVar5 = fast_expansion_sum_zeroelim(iVar6,adStack_2b5f8,iVar5,adStack_2b5b8,adStack_2b878);
  iVar6 = scale_expansion_zeroelim(4,&dStack_2c138,dVar19,adStack_2b5f8);
  iVar7 = scale_expansion_zeroelim(4,&dStack_2c178,-dVar23,adStack_2b638);
  iVar6 = fast_expansion_sum_zeroelim(iVar6,adStack_2b5f8,iVar7,adStack_2b638,adStack_2b5b8);
  iVar7 = scale_expansion_zeroelim(4,&dStack_2c118,dVar44,adStack_2b5f8);
  iVar6 = fast_expansion_sum_zeroelim(iVar7,adStack_2b5f8,iVar6,adStack_2b5b8,adStack_2b938);
  iVar7 = scale_expansion_zeroelim(4,&dStack_2c1b8,dVar23,adStack_2b5f8);
  iVar8 = scale_expansion_zeroelim(4,&dStack_2c198,-dVar44,adStack_2b638);
  iVar7 = fast_expansion_sum_zeroelim(iVar7,adStack_2b5f8,iVar8,adStack_2b638,adStack_2b5b8);
  iVar8 = scale_expansion_zeroelim(4,&dStack_2c138,dVar30,adStack_2b5f8);
  iVar7 = fast_expansion_sum_zeroelim(iVar8,adStack_2b5f8,iVar7,adStack_2b5b8,adStack_2b9f8);
  iVar8 = scale_expansion_zeroelim(4,&dStack_2c1d8,dVar44,adStack_2b5f8);
  iVar9 = scale_expansion_zeroelim(4,&dStack_2c178,dVar30,adStack_2b638);
  iVar8 = fast_expansion_sum_zeroelim(iVar8,adStack_2b5f8,iVar9,adStack_2b638,adStack_2b5b8);
  iVar9 = scale_expansion_zeroelim(4,&dStack_2c1b8,dVar19,adStack_2b5f8);
  iVar8 = fast_expansion_sum_zeroelim(iVar9,adStack_2b5f8,iVar8,adStack_2b5b8,adStack_2bab8);
  iVar9 = scale_expansion_zeroelim(4,&dStack_2c1f8,dVar30,adStack_2b5f8);
  iVar10 = scale_expansion_zeroelim(4,&dStack_2c198,dVar53,adStack_2b638);
  iVar9 = fast_expansion_sum_zeroelim(iVar9,adStack_2b5f8,iVar10,adStack_2b638,adStack_2b5b8);
  iVar10 = scale_expansion_zeroelim(4,&dStack_2c0d8,dVar23,adStack_2b5f8);
  iVar9 = fast_expansion_sum_zeroelim(iVar10,adStack_2b5f8,iVar9,adStack_2b5b8,adStack_2bb78);
  iVar10 = scale_expansion_zeroelim(4,&dStack_2c178,dVar53,adStack_2b5f8);
  iVar11 = scale_expansion_zeroelim(4,&dStack_2c158,dVar19,adStack_2b638);
  iVar10 = fast_expansion_sum_zeroelim(iVar10,adStack_2b5f8,iVar11,adStack_2b638,adStack_2b5b8);
  iVar11 = scale_expansion_zeroelim(4,&dStack_2c0f8,dVar44,adStack_2b5f8);
  iVar10 = fast_expansion_sum_zeroelim(iVar11,adStack_2b5f8,iVar10,adStack_2b5b8,adStack_2bc38);
  iVar11 = scale_expansion_zeroelim(4,&dStack_2c198,dVar19,adStack_2b5f8);
  iVar12 = scale_expansion_zeroelim(4,&dStack_2c1d8,dVar23,adStack_2b638);
  iVar11 = fast_expansion_sum_zeroelim(iVar11,adStack_2b5f8,iVar12,adStack_2b638,adStack_2b5b8);
  iVar12 = scale_expansion_zeroelim(4,&dStack_2c118,dVar30,adStack_2b5f8);
  iVar11 = fast_expansion_sum_zeroelim(iVar12,adStack_2b5f8,iVar11,adStack_2b5b8,adStack_2bcf8);
  iVar12 = scale_expansion_zeroelim(4,&dStack_2c158,dVar23,adStack_2b5f8);
  iVar13 = scale_expansion_zeroelim(4,&dStack_2c1f8,dVar44,adStack_2b638);
  iVar12 = fast_expansion_sum_zeroelim(iVar12,adStack_2b5f8,iVar13,adStack_2b638,adStack_2b5b8);
  iVar13 = scale_expansion_zeroelim(4,&dStack_2c138,dVar53,adStack_2b5f8);
  iVar12 = fast_expansion_sum_zeroelim(iVar13,adStack_2b5f8,iVar12,adStack_2b5b8,adStack_2bdb8);
  iVar13 = fast_expansion_sum_zeroelim(iVar5,adStack_2b878,iVar9,adStack_2bb78,adStack_2bf38);
  uVar14 = fast_expansion_sum_zeroelim(iVar11,adStack_2bcf8,iVar4,adStack_2b7b8,adStack_2c0b8);
  if (0 < (int)uVar14) {
    uVar17 = 0;
    do {
      adStack_2c0b8[uVar17] = -adStack_2c0b8[uVar17];
      uVar17 = uVar17 + 1;
    } while (uVar14 != uVar17);
  }
  iVar13 = fast_expansion_sum_zeroelim(iVar13,adStack_2bf38,uVar14,adStack_2c0b8,adStack_28238);
  iVar15 = scale_expansion_zeroelim(iVar13,adStack_28238,dVar1,adStack_2a938);
  iVar15 = scale_expansion_zeroelim(iVar15,adStack_2a938,dVar1,adStack_2b538);
  iVar16 = scale_expansion_zeroelim(iVar13,adStack_28238,b,adStack_2a938);
  iVar16 = scale_expansion_zeroelim(iVar16,adStack_2a938,b,adStack_29738);
  iVar13 = scale_expansion_zeroelim(iVar13,adStack_28238,dVar44,adStack_2a938);
  iVar13 = scale_expansion_zeroelim(iVar13,adStack_2a938,dVar44,adStack_2a338);
  iVar15 = fast_expansion_sum_zeroelim(iVar15,adStack_2b538,iVar16,adStack_29738,adStack_27c38);
  iVar13 = fast_expansion_sum_zeroelim(iVar15,adStack_27c38,iVar13,adStack_2a338,adStack_1f838);
  iVar15 = fast_expansion_sum_zeroelim(iVar6,adStack_2b938,iVar10,adStack_2bc38,adStack_2bf38);
  uVar14 = fast_expansion_sum_zeroelim(iVar12,adStack_2bdb8,iVar5,adStack_2b878,adStack_2c0b8);
  if (0 < (int)uVar14) {
    uVar17 = 0;
    do {
      adStack_2c0b8[uVar17] = -adStack_2c0b8[uVar17];
      uVar17 = uVar17 + 1;
    } while (uVar14 != uVar17);
  }
  iVar5 = fast_expansion_sum_zeroelim(iVar15,adStack_2bf38,uVar14,adStack_2c0b8,adStack_28538);
  dVar1 = *pb;
  iVar15 = scale_expansion_zeroelim(iVar5,adStack_28538,dVar1,adStack_2a938);
  iVar15 = scale_expansion_zeroelim(iVar15,adStack_2a938,dVar1,adStack_2b538);
  dVar1 = pb[1];
  iVar16 = scale_expansion_zeroelim(iVar5,adStack_28538,dVar1,adStack_2a938);
  iVar16 = scale_expansion_zeroelim(iVar16,adStack_2a938,dVar1,adStack_29738);
  iVar5 = scale_expansion_zeroelim(iVar5,adStack_28538,dVar30,adStack_2a938);
  iVar5 = scale_expansion_zeroelim(iVar5,adStack_2a938,dVar30,adStack_2a338);
  iVar15 = fast_expansion_sum_zeroelim(iVar15,adStack_2b538,iVar16,adStack_29738,adStack_27c38);
  iVar5 = fast_expansion_sum_zeroelim(iVar15,adStack_27c38,iVar5,adStack_2a338,adStack_21c38);
  iVar11 = fast_expansion_sum_zeroelim(iVar7,adStack_2b9f8,iVar11,adStack_2bcf8,adStack_2bf38);
  uVar14 = fast_expansion_sum_zeroelim(iVar8,adStack_2bab8,iVar6,adStack_2b938,adStack_2c0b8);
  if (0 < (int)uVar14) {
    uVar17 = 0;
    do {
      adStack_2c0b8[uVar17] = -adStack_2c0b8[uVar17];
      uVar17 = uVar17 + 1;
    } while (uVar14 != uVar17);
  }
  iVar6 = fast_expansion_sum_zeroelim(iVar11,adStack_2bf38,uVar14,adStack_2c0b8,adStack_28838);
  dVar1 = *pc;
  iVar11 = scale_expansion_zeroelim(iVar6,adStack_28838,dVar1,adStack_2a938);
  iVar11 = scale_expansion_zeroelim(iVar11,adStack_2a938,dVar1,adStack_2b538);
  dVar1 = pc[1];
  iVar15 = scale_expansion_zeroelim(iVar6,adStack_28838,dVar1,adStack_2a938);
  iVar15 = scale_expansion_zeroelim(iVar15,adStack_2a938,dVar1,adStack_29738);
  iVar6 = scale_expansion_zeroelim(iVar6,adStack_28838,dVar53,adStack_2a938);
  iVar6 = scale_expansion_zeroelim(iVar6,adStack_2a938,dVar53,adStack_2a338);
  iVar11 = fast_expansion_sum_zeroelim(iVar11,adStack_2b538,iVar15,adStack_29738,adStack_27c38);
  iVar6 = fast_expansion_sum_zeroelim(iVar11,adStack_27c38,iVar6,adStack_2a338,adStack_24038);
  iVar11 = fast_expansion_sum_zeroelim(iVar3,adStack_2b6f8,iVar12,adStack_2bdb8,adStack_2bf38);
  uVar14 = fast_expansion_sum_zeroelim(iVar9,adStack_2bb78,iVar7,adStack_2b9f8,adStack_2c0b8);
  if (0 < (int)uVar14) {
    uVar17 = 0;
    do {
      adStack_2c0b8[uVar17] = -adStack_2c0b8[uVar17];
      uVar17 = uVar17 + 1;
    } while (uVar14 != uVar17);
  }
  iVar7 = fast_expansion_sum_zeroelim(iVar11,adStack_2bf38,uVar14,adStack_2c0b8,adStack_28b38);
  dVar1 = *pd;
  iVar9 = scale_expansion_zeroelim(iVar7,adStack_28b38,dVar1,adStack_2a938);
  iVar9 = scale_expansion_zeroelim(iVar9,adStack_2a938,dVar1,adStack_2b538);
  dVar1 = pd[1];
  iVar11 = scale_expansion_zeroelim(iVar7,adStack_28b38,dVar1,adStack_2a938);
  iVar11 = scale_expansion_zeroelim(iVar11,adStack_2a938,dVar1,adStack_29738);
  iVar7 = scale_expansion_zeroelim(iVar7,adStack_28b38,dVar19,adStack_2a938);
  iVar7 = scale_expansion_zeroelim(iVar7,adStack_2a938,dVar19,adStack_2a338);
  iVar9 = fast_expansion_sum_zeroelim(iVar9,adStack_2b538,iVar11,adStack_29738,adStack_27c38);
  iVar7 = fast_expansion_sum_zeroelim(iVar9,adStack_27c38,iVar7,adStack_2a338,adStack_26438);
  iVar4 = fast_expansion_sum_zeroelim(iVar4,adStack_2b7b8,iVar8,adStack_2bab8,adStack_2bf38);
  uVar14 = fast_expansion_sum_zeroelim(iVar10,adStack_2bc38,iVar3,adStack_2b6f8,adStack_2c0b8);
  if (0 < (int)uVar14) {
    uVar17 = 0;
    do {
      adStack_2c0b8[uVar17] = -adStack_2c0b8[uVar17];
      uVar17 = uVar17 + 1;
    } while (uVar14 != uVar17);
  }
  iVar3 = fast_expansion_sum_zeroelim(iVar4,adStack_2bf38,uVar14,adStack_2c0b8,adStack_27f38);
  dVar1 = *pe;
  iVar4 = scale_expansion_zeroelim(iVar3,adStack_27f38,dVar1,adStack_2a938);
  iVar4 = scale_expansion_zeroelim(iVar4,adStack_2a938,dVar1,adStack_2b538);
  dVar1 = pe[1];
  iVar8 = scale_expansion_zeroelim(iVar3,adStack_27f38,dVar1,adStack_2a938);
  iVar8 = scale_expansion_zeroelim(iVar8,adStack_2a938,dVar1,adStack_29738);
  iVar3 = scale_expansion_zeroelim(iVar3,adStack_27f38,dVar23,adStack_2a938);
  iVar3 = scale_expansion_zeroelim(iVar3,adStack_2a938,dVar23,adStack_2a338);
  iVar4 = fast_expansion_sum_zeroelim(iVar4,adStack_2b538,iVar8,adStack_29738,adStack_27c38);
  iVar3 = fast_expansion_sum_zeroelim(iVar4,adStack_27c38,iVar3,adStack_2a338,adStack_1d438);
  iVar4 = fast_expansion_sum_zeroelim(iVar13,adStack_1f838,iVar5,adStack_21c38,adStack_16838);
  iVar5 = fast_expansion_sum_zeroelim(iVar6,adStack_24038,iVar7,adStack_26438,adStack_1b038);
  iVar3 = fast_expansion_sum_zeroelim(iVar5,adStack_1b038,iVar3,adStack_1d438,local_6c38);
  iVar3 = fast_expansion_sum_zeroelim(iVar4,adStack_16838,iVar3,local_6c38,adStack_12040 + 1);
  return adStack_12040[iVar3];
}

Assistant:

REAL insphereexact(REAL *pa, REAL *pb, REAL *pc, REAL *pd, REAL *pe)
{
  INEXACT REAL axby1, bxcy1, cxdy1, dxey1, exay1;
  INEXACT REAL bxay1, cxby1, dxcy1, exdy1, axey1;
  INEXACT REAL axcy1, bxdy1, cxey1, dxay1, exby1;
  INEXACT REAL cxay1, dxby1, excy1, axdy1, bxey1;
  REAL axby0, bxcy0, cxdy0, dxey0, exay0;
  REAL bxay0, cxby0, dxcy0, exdy0, axey0;
  REAL axcy0, bxdy0, cxey0, dxay0, exby0;
  REAL cxay0, dxby0, excy0, axdy0, bxey0;
  REAL ab[4], bc[4], cd[4], de[4], ea[4];
  REAL ac[4], bd[4], ce[4], da[4], eb[4];
  REAL temp8a[8], temp8b[8], temp16[16];
  int temp8alen, temp8blen, temp16len;
  REAL abc[24], bcd[24], cde[24], dea[24], eab[24];
  REAL abd[24], bce[24], cda[24], deb[24], eac[24];
  int abclen, bcdlen, cdelen, dealen, eablen;
  int abdlen, bcelen, cdalen, deblen, eaclen;
  REAL temp48a[48], temp48b[48];
  int temp48alen, temp48blen;
  REAL abcd[96], bcde[96], cdea[96], deab[96], eabc[96];
  int abcdlen, bcdelen, cdealen, deablen, eabclen;
  REAL temp192[192];
  REAL det384x[384], det384y[384], det384z[384];
  int xlen, ylen, zlen;
  REAL detxy[768];
  int xylen;
  REAL adet[1152], bdet[1152], cdet[1152], ddet[1152], edet[1152];
  int alen, blen, clen, dlen, elen;
  REAL abdet[2304], cddet[2304], cdedet[3456];
  int ablen, cdlen;
  REAL deter[5760];
  int deterlen;
  int i;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL ahi, alo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j;
  REAL _0;


  Two_Product(pa[0], pb[1], axby1, axby0);
  Two_Product(pb[0], pa[1], bxay1, bxay0);
  Two_Two_Diff(axby1, axby0, bxay1, bxay0, ab[3], ab[2], ab[1], ab[0]);

  Two_Product(pb[0], pc[1], bxcy1, bxcy0);
  Two_Product(pc[0], pb[1], cxby1, cxby0);
  Two_Two_Diff(bxcy1, bxcy0, cxby1, cxby0, bc[3], bc[2], bc[1], bc[0]);

  Two_Product(pc[0], pd[1], cxdy1, cxdy0);
  Two_Product(pd[0], pc[1], dxcy1, dxcy0);
  Two_Two_Diff(cxdy1, cxdy0, dxcy1, dxcy0, cd[3], cd[2], cd[1], cd[0]);

  Two_Product(pd[0], pe[1], dxey1, dxey0);
  Two_Product(pe[0], pd[1], exdy1, exdy0);
  Two_Two_Diff(dxey1, dxey0, exdy1, exdy0, de[3], de[2], de[1], de[0]);

  Two_Product(pe[0], pa[1], exay1, exay0);
  Two_Product(pa[0], pe[1], axey1, axey0);
  Two_Two_Diff(exay1, exay0, axey1, axey0, ea[3], ea[2], ea[1], ea[0]);

  Two_Product(pa[0], pc[1], axcy1, axcy0);
  Two_Product(pc[0], pa[1], cxay1, cxay0);
  Two_Two_Diff(axcy1, axcy0, cxay1, cxay0, ac[3], ac[2], ac[1], ac[0]);

  Two_Product(pb[0], pd[1], bxdy1, bxdy0);
  Two_Product(pd[0], pb[1], dxby1, dxby0);
  Two_Two_Diff(bxdy1, bxdy0, dxby1, dxby0, bd[3], bd[2], bd[1], bd[0]);

  Two_Product(pc[0], pe[1], cxey1, cxey0);
  Two_Product(pe[0], pc[1], excy1, excy0);
  Two_Two_Diff(cxey1, cxey0, excy1, excy0, ce[3], ce[2], ce[1], ce[0]);

  Two_Product(pd[0], pa[1], dxay1, dxay0);
  Two_Product(pa[0], pd[1], axdy1, axdy0);
  Two_Two_Diff(dxay1, dxay0, axdy1, axdy0, da[3], da[2], da[1], da[0]);

  Two_Product(pe[0], pb[1], exby1, exby0);
  Two_Product(pb[0], pe[1], bxey1, bxey0);
  Two_Two_Diff(exby1, exby0, bxey1, bxey0, eb[3], eb[2], eb[1], eb[0]);

  temp8alen = scale_expansion_zeroelim(4, bc, pa[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, ac, -pb[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, ab, pc[2], temp8a);
  abclen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       abc);

  temp8alen = scale_expansion_zeroelim(4, cd, pb[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, bd, -pc[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, bc, pd[2], temp8a);
  bcdlen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       bcd);

  temp8alen = scale_expansion_zeroelim(4, de, pc[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, ce, -pd[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, cd, pe[2], temp8a);
  cdelen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       cde);

  temp8alen = scale_expansion_zeroelim(4, ea, pd[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, da, -pe[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, de, pa[2], temp8a);
  dealen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       dea);

  temp8alen = scale_expansion_zeroelim(4, ab, pe[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, eb, -pa[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, ea, pb[2], temp8a);
  eablen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       eab);

  temp8alen = scale_expansion_zeroelim(4, bd, pa[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, da, pb[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, ab, pd[2], temp8a);
  abdlen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       abd);

  temp8alen = scale_expansion_zeroelim(4, ce, pb[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, eb, pc[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, bc, pe[2], temp8a);
  bcelen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       bce);

  temp8alen = scale_expansion_zeroelim(4, da, pc[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, ac, pd[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, cd, pa[2], temp8a);
  cdalen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       cda);

  temp8alen = scale_expansion_zeroelim(4, eb, pd[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, bd, pe[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, de, pb[2], temp8a);
  deblen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       deb);

  temp8alen = scale_expansion_zeroelim(4, ac, pe[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, ce, pa[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, ea, pc[2], temp8a);
  eaclen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       eac);

  temp48alen = fast_expansion_sum_zeroelim(cdelen, cde, bcelen, bce, temp48a);
  temp48blen = fast_expansion_sum_zeroelim(deblen, deb, bcdlen, bcd, temp48b);
  for (i = 0; i < temp48blen; i++) {
    temp48b[i] = -temp48b[i];
  }
  bcdelen = fast_expansion_sum_zeroelim(temp48alen, temp48a,
                                        temp48blen, temp48b, bcde);
  xlen = scale_expansion_zeroelim(bcdelen, bcde, pa[0], temp192);
  xlen = scale_expansion_zeroelim(xlen, temp192, pa[0], det384x);
  ylen = scale_expansion_zeroelim(bcdelen, bcde, pa[1], temp192);
  ylen = scale_expansion_zeroelim(ylen, temp192, pa[1], det384y);
  zlen = scale_expansion_zeroelim(bcdelen, bcde, pa[2], temp192);
  zlen = scale_expansion_zeroelim(zlen, temp192, pa[2], det384z);
  xylen = fast_expansion_sum_zeroelim(xlen, det384x, ylen, det384y, detxy);
  alen = fast_expansion_sum_zeroelim(xylen, detxy, zlen, det384z, adet);

  temp48alen = fast_expansion_sum_zeroelim(dealen, dea, cdalen, cda, temp48a);
  temp48blen = fast_expansion_sum_zeroelim(eaclen, eac, cdelen, cde, temp48b);
  for (i = 0; i < temp48blen; i++) {
    temp48b[i] = -temp48b[i];
  }
  cdealen = fast_expansion_sum_zeroelim(temp48alen, temp48a,
                                        temp48blen, temp48b, cdea);
  xlen = scale_expansion_zeroelim(cdealen, cdea, pb[0], temp192);
  xlen = scale_expansion_zeroelim(xlen, temp192, pb[0], det384x);
  ylen = scale_expansion_zeroelim(cdealen, cdea, pb[1], temp192);
  ylen = scale_expansion_zeroelim(ylen, temp192, pb[1], det384y);
  zlen = scale_expansion_zeroelim(cdealen, cdea, pb[2], temp192);
  zlen = scale_expansion_zeroelim(zlen, temp192, pb[2], det384z);
  xylen = fast_expansion_sum_zeroelim(xlen, det384x, ylen, det384y, detxy);
  blen = fast_expansion_sum_zeroelim(xylen, detxy, zlen, det384z, bdet);

  temp48alen = fast_expansion_sum_zeroelim(eablen, eab, deblen, deb, temp48a);
  temp48blen = fast_expansion_sum_zeroelim(abdlen, abd, dealen, dea, temp48b);
  for (i = 0; i < temp48blen; i++) {
    temp48b[i] = -temp48b[i];
  }
  deablen = fast_expansion_sum_zeroelim(temp48alen, temp48a,
                                        temp48blen, temp48b, deab);
  xlen = scale_expansion_zeroelim(deablen, deab, pc[0], temp192);
  xlen = scale_expansion_zeroelim(xlen, temp192, pc[0], det384x);
  ylen = scale_expansion_zeroelim(deablen, deab, pc[1], temp192);
  ylen = scale_expansion_zeroelim(ylen, temp192, pc[1], det384y);
  zlen = scale_expansion_zeroelim(deablen, deab, pc[2], temp192);
  zlen = scale_expansion_zeroelim(zlen, temp192, pc[2], det384z);
  xylen = fast_expansion_sum_zeroelim(xlen, det384x, ylen, det384y, detxy);
  clen = fast_expansion_sum_zeroelim(xylen, detxy, zlen, det384z, cdet);

  temp48alen = fast_expansion_sum_zeroelim(abclen, abc, eaclen, eac, temp48a);
  temp48blen = fast_expansion_sum_zeroelim(bcelen, bce, eablen, eab, temp48b);
  for (i = 0; i < temp48blen; i++) {
    temp48b[i] = -temp48b[i];
  }
  eabclen = fast_expansion_sum_zeroelim(temp48alen, temp48a,
                                        temp48blen, temp48b, eabc);
  xlen = scale_expansion_zeroelim(eabclen, eabc, pd[0], temp192);
  xlen = scale_expansion_zeroelim(xlen, temp192, pd[0], det384x);
  ylen = scale_expansion_zeroelim(eabclen, eabc, pd[1], temp192);
  ylen = scale_expansion_zeroelim(ylen, temp192, pd[1], det384y);
  zlen = scale_expansion_zeroelim(eabclen, eabc, pd[2], temp192);
  zlen = scale_expansion_zeroelim(zlen, temp192, pd[2], det384z);
  xylen = fast_expansion_sum_zeroelim(xlen, det384x, ylen, det384y, detxy);
  dlen = fast_expansion_sum_zeroelim(xylen, detxy, zlen, det384z, ddet);

  temp48alen = fast_expansion_sum_zeroelim(bcdlen, bcd, abdlen, abd, temp48a);
  temp48blen = fast_expansion_sum_zeroelim(cdalen, cda, abclen, abc, temp48b);
  for (i = 0; i < temp48blen; i++) {
    temp48b[i] = -temp48b[i];
  }
  abcdlen = fast_expansion_sum_zeroelim(temp48alen, temp48a,
                                        temp48blen, temp48b, abcd);
  xlen = scale_expansion_zeroelim(abcdlen, abcd, pe[0], temp192);
  xlen = scale_expansion_zeroelim(xlen, temp192, pe[0], det384x);
  ylen = scale_expansion_zeroelim(abcdlen, abcd, pe[1], temp192);
  ylen = scale_expansion_zeroelim(ylen, temp192, pe[1], det384y);
  zlen = scale_expansion_zeroelim(abcdlen, abcd, pe[2], temp192);
  zlen = scale_expansion_zeroelim(zlen, temp192, pe[2], det384z);
  xylen = fast_expansion_sum_zeroelim(xlen, det384x, ylen, det384y, detxy);
  elen = fast_expansion_sum_zeroelim(xylen, detxy, zlen, det384z, edet);

  ablen = fast_expansion_sum_zeroelim(alen, adet, blen, bdet, abdet);
  cdlen = fast_expansion_sum_zeroelim(clen, cdet, dlen, ddet, cddet);
  cdelen = fast_expansion_sum_zeroelim(cdlen, cddet, elen, edet, cdedet);
  deterlen = fast_expansion_sum_zeroelim(ablen, abdet, cdelen, cdedet, deter);

  return deter[deterlen - 1];
}